

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re_search.c
# Opt level: O1

int re_forwsearch(int f,int n)

{
  int iVar1;
  
  iVar1 = re_readpattern("RE Search");
  if (iVar1 == 1) {
    iVar1 = re_forwsrch();
    if (iVar1 == 0) {
      dobeep();
      iVar1 = 0;
      ewprintf("Search failed: \"%s\"",re_pat);
    }
    else {
      re_srch_lastdir = -1;
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

int
re_forwsearch(int f, int n)
{
	int	s;

	if ((s = re_readpattern("RE Search")) != TRUE)
		return (s);
	if (re_forwsrch() == FALSE) {
		dobeep();
		ewprintf("Search failed: \"%s\"", re_pat);
		return (FALSE);
	}
	re_srch_lastdir = SRCH_FORW;
	return (TRUE);
}